

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Reg1Unsigned1(ByteCodeWriter *this,OpCode op,RegSlot R0,uint C1)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot R0_00;
  undefined4 *puVar5;
  OpCode OVar6;
  OpCode local_34;
  ProfileId local_32 [3];
  OpCode op_local;
  ProfileId profileId;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0xa);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x958,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_007d042c;
    *puVar5 = 0;
  }
  R0_00 = ConsumeReg(this,R0);
  bVar3 = DoProfileNewScArrayOp(this,op);
  OVar6 = op;
  if (bVar3) {
    bVar3 = DoDynamicProfileOpcode(this,NativeArrayPhase,true);
    if (!bVar3) goto LAB_007d033f;
    TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
    if (TVar1 == 0xffff) goto LAB_007d033f;
    this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
LAB_007d0358:
    OpCodeUtil::ConvertNonCallOpToProfiled(&local_34);
    bVar3 = true;
  }
  else {
LAB_007d033f:
    if (op == InitForInEnumerator) {
      bVar3 = FunctionBody::AllocProfiledForInLoopCount(this->m_functionWrite,local_32);
      if (bVar3) goto LAB_007d0358;
      OVar6 = InitForInEnumerator;
    }
    bVar3 = false;
  }
  bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,OVar6,R0_00,C1);
  if (!bVar4) {
    bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,C1);
    if (!bVar4) {
      bVar4 = TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,R0_00,C1);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x967,"(success)","success");
        if (!bVar4) {
LAB_007d042c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
  }
  if (bVar3) {
    Data::Write(&this->m_byteCodeData,local_32,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg1Unsigned1(OpCode op, RegSlot R0, uint C1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg1Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);

        ProfileId profileId = Constants::NoProfileId;
        bool isProfiled = (DoProfileNewScArrayOp(op) &&
            DoDynamicProfileOpcode(NativeArrayPhase, true) &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId))
            || (op == OpCode::InitForInEnumerator &&
                this->m_functionWrite->AllocProfiledForInLoopCount(&profileId));

        if (isProfiled)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        MULTISIZE_LAYOUT_WRITE(Reg1Unsigned1, op, R0, C1);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }